

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Materials.cpp
# Opt level: O0

SP __thiscall pbrt::SemanticParser::createMaterial_uber(SemanticParser *this,SP *in)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  element_type *peVar4;
  runtime_error *prVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ParamSet *in_RSI;
  element_type *in_RDI;
  float fVar6;
  SP SVar7;
  string name;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
  it;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>_>
  *__range1;
  SP mat;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
  *in_stack_fffffffffffffce8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
  *in_stack_fffffffffffffcf0;
  undefined6 in_stack_fffffffffffffcf8;
  undefined1 in_stack_fffffffffffffcfe;
  undefined1 in_stack_fffffffffffffcff;
  float in_stack_fffffffffffffd00;
  undefined2 in_stack_fffffffffffffd04;
  undefined1 in_stack_fffffffffffffd06;
  undefined1 in_stack_fffffffffffffd07;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd18;
  float in_stack_fffffffffffffd20;
  undefined1 in_stack_fffffffffffffd24;
  undefined1 in_stack_fffffffffffffd25;
  float in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd2c;
  element_type *in_stack_fffffffffffffd30;
  undefined6 in_stack_fffffffffffffd38;
  undefined1 in_stack_fffffffffffffd3e;
  float in_stack_fffffffffffffd40;
  undefined2 in_stack_fffffffffffffd44;
  undefined1 in_stack_fffffffffffffd46;
  undefined1 in_stack_fffffffffffffd47;
  SemanticParser *in_stack_fffffffffffffd48;
  element_type *name_00;
  string *in_stack_fffffffffffffdc8;
  float *in_stack_fffffffffffffdd0;
  ParamSet *in_stack_fffffffffffffdd8;
  string *in_stack_fffffffffffffde0;
  ParamSet *in_stack_fffffffffffffde8;
  vec3f local_18c [6];
  vec3f local_13c [4];
  vec3f local_10c [4];
  vec3f local_dc [4];
  vec3f local_ac;
  string local_a0 [48];
  string local_70 [48];
  _Self local_40;
  _Self local_38;
  element_type *local_30;
  
  name_00 = in_RDI;
  std::__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x1a4f2a);
  std::make_shared<pbrt::UberMaterial,std::__cxx11::string&>(in_stack_fffffffffffffd18);
  local_30 = std::
             __shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1a4f4b);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>_>
       ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>_>
                *)in_stack_fffffffffffffce8);
  local_40._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>_>
              *)in_stack_fffffffffffffce8);
  do {
    bVar1 = std::operator!=(&local_38,&local_40);
    if (!bVar1) {
      std::shared_ptr<pbrt::Material>::shared_ptr<pbrt::UberMaterial,void>
                ((shared_ptr<pbrt::Material> *)in_stack_fffffffffffffcf0,
                 (shared_ptr<pbrt::UberMaterial> *)in_stack_fffffffffffffce8);
      std::shared_ptr<pbrt::UberMaterial>::~shared_ptr((shared_ptr<pbrt::UberMaterial> *)0x1a6031);
      SVar7.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           extraout_RDX._M_pi;
      SVar7.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr = name_00;
      return (SP)SVar7.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>;
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>
    ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>
                 *)0x1a4fa8);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
    ::pair(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
    std::__cxx11::string::string(local_a0,local_70);
    bVar1 = std::operator==(&in_stack_fffffffffffffcf0->first,(char *)in_stack_fffffffffffffce8);
    if (bVar1) {
      std::__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1a500b);
      bVar1 = syntactic::ParamSet::hasParamTexture
                        ((ParamSet *)
                         CONCAT17(in_stack_fffffffffffffd07,
                                  CONCAT16(in_stack_fffffffffffffd06,
                                           CONCAT24(in_stack_fffffffffffffd04,
                                                    in_stack_fffffffffffffd00))),
                         (string *)
                         CONCAT17(in_stack_fffffffffffffcff,
                                  CONCAT16(in_stack_fffffffffffffcfe,in_stack_fffffffffffffcf8)));
      if (bVar1) {
        math::vec3f::vec3f(&local_ac,1.0);
        peVar4 = std::
                 __shared_ptr_access<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1a5058);
        (peVar4->kd).z = local_ac.z;
        (peVar4->kd).x = local_ac.x;
        (peVar4->kd).y = local_ac.y;
        std::
        __shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1a507b);
        syntactic::ParamSet::getParamTexture(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
        findOrCreateTexture(in_stack_fffffffffffffd48,
                            (SP *)CONCAT17(in_stack_fffffffffffffd47,
                                           CONCAT16(in_stack_fffffffffffffd46,
                                                    CONCAT24(in_stack_fffffffffffffd44,
                                                             in_stack_fffffffffffffd40))));
        std::__shared_ptr_access<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1a50c1);
        std::shared_ptr<pbrt::Texture>::operator=
                  ((shared_ptr<pbrt::Texture> *)in_stack_fffffffffffffcf0,
                   (shared_ptr<pbrt::Texture> *)in_stack_fffffffffffffce8);
        std::shared_ptr<pbrt::Texture>::~shared_ptr((shared_ptr<pbrt::Texture> *)0x1a50e2);
        std::shared_ptr<pbrt::syntactic::Texture>::~shared_ptr
                  ((shared_ptr<pbrt::syntactic::Texture> *)0x1a50ef);
      }
      else {
        std::
        __shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1a5172);
        std::__shared_ptr_access<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1a5187);
        syntactic::ParamSet::getParam3f
                  (in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
      }
    }
    else {
      bVar1 = std::operator==(&in_stack_fffffffffffffcf0->first,(char *)in_stack_fffffffffffffce8);
      if (bVar1) {
        std::
        __shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1a51e6);
        bVar1 = syntactic::ParamSet::hasParamTexture
                          ((ParamSet *)
                           CONCAT17(in_stack_fffffffffffffd07,
                                    CONCAT16(in_stack_fffffffffffffd06,
                                             CONCAT24(in_stack_fffffffffffffd04,
                                                      in_stack_fffffffffffffd00))),
                           (string *)
                           CONCAT17(in_stack_fffffffffffffcff,
                                    CONCAT16(in_stack_fffffffffffffcfe,in_stack_fffffffffffffcf8)));
        if (bVar1) {
          math::vec3f::vec3f(local_dc,1.0);
          peVar4 = std::
                   __shared_ptr_access<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x1a5233);
          (peVar4->kr).z = local_dc[0].z;
          (peVar4->kr).x = local_dc[0].x;
          (peVar4->kr).y = local_dc[0].y;
          std::
          __shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1a5259);
          syntactic::ParamSet::getParamTexture(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
          findOrCreateTexture(in_stack_fffffffffffffd48,
                              (SP *)CONCAT17(in_stack_fffffffffffffd47,
                                             CONCAT16(in_stack_fffffffffffffd46,
                                                      CONCAT24(in_stack_fffffffffffffd44,
                                                               in_stack_fffffffffffffd40))));
          std::__shared_ptr_access<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1a529f);
          std::shared_ptr<pbrt::Texture>::operator=
                    ((shared_ptr<pbrt::Texture> *)in_stack_fffffffffffffcf0,
                     (shared_ptr<pbrt::Texture> *)in_stack_fffffffffffffce8);
          std::shared_ptr<pbrt::Texture>::~shared_ptr((shared_ptr<pbrt::Texture> *)0x1a52c3);
          std::shared_ptr<pbrt::syntactic::Texture>::~shared_ptr
                    ((shared_ptr<pbrt::syntactic::Texture> *)0x1a52d0);
        }
        else {
          std::
          __shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1a5305);
          std::__shared_ptr_access<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1a531a);
          syntactic::ParamSet::getParam3f
                    (in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
        }
      }
      else {
        bVar1 = std::operator==(&in_stack_fffffffffffffcf0->first,(char *)in_stack_fffffffffffffce8)
        ;
        if (bVar1) {
          std::
          __shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1a5373);
          bVar1 = syntactic::ParamSet::hasParamTexture
                            ((ParamSet *)
                             CONCAT17(in_stack_fffffffffffffd07,
                                      CONCAT16(in_stack_fffffffffffffd06,
                                               CONCAT24(in_stack_fffffffffffffd04,
                                                        in_stack_fffffffffffffd00))),
                             (string *)
                             CONCAT17(in_stack_fffffffffffffcff,
                                      CONCAT16(in_stack_fffffffffffffcfe,in_stack_fffffffffffffcf8))
                            );
          if (bVar1) {
            math::vec3f::vec3f(local_10c,1.0);
            peVar4 = std::
                     __shared_ptr_access<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x1a53ba);
            (peVar4->kt).z = local_10c[0].z;
            (peVar4->kt).x = local_10c[0].x;
            (peVar4->kt).y = local_10c[0].y;
            std::
            __shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1a53e3);
            syntactic::ParamSet::getParamTexture
                      (in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
            findOrCreateTexture(in_stack_fffffffffffffd48,
                                (SP *)CONCAT17(in_stack_fffffffffffffd47,
                                               CONCAT16(in_stack_fffffffffffffd46,
                                                        CONCAT24(in_stack_fffffffffffffd44,
                                                                 in_stack_fffffffffffffd40))));
            std::__shared_ptr_access<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1a5429);
            std::shared_ptr<pbrt::Texture>::operator=
                      ((shared_ptr<pbrt::Texture> *)in_stack_fffffffffffffcf0,
                       (shared_ptr<pbrt::Texture> *)in_stack_fffffffffffffce8);
            std::shared_ptr<pbrt::Texture>::~shared_ptr((shared_ptr<pbrt::Texture> *)0x1a544d);
            std::shared_ptr<pbrt::syntactic::Texture>::~shared_ptr
                      ((shared_ptr<pbrt::syntactic::Texture> *)0x1a545a);
          }
          else {
            std::
            __shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1a548f);
            std::__shared_ptr_access<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1a54a1);
            syntactic::ParamSet::getParam3f
                      (in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8
                      );
          }
        }
        else {
          bVar1 = std::operator==(&in_stack_fffffffffffffcf0->first,
                                  (char *)in_stack_fffffffffffffce8);
          if (bVar1) {
            std::
            __shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1a54fa);
            bVar1 = syntactic::ParamSet::hasParamTexture
                              ((ParamSet *)
                               CONCAT17(in_stack_fffffffffffffd07,
                                        CONCAT16(in_stack_fffffffffffffd06,
                                                 CONCAT24(in_stack_fffffffffffffd04,
                                                          in_stack_fffffffffffffd00))),
                               (string *)
                               CONCAT17(in_stack_fffffffffffffcff,
                                        CONCAT16(in_stack_fffffffffffffcfe,in_stack_fffffffffffffcf8
                                                )));
            if (bVar1) {
              math::vec3f::vec3f(local_13c,1.0);
              peVar4 = std::
                       __shared_ptr_access<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)0x1a5541);
              (peVar4->ks).z = local_13c[0].z;
              (peVar4->ks).x = local_13c[0].x;
              (peVar4->ks).y = local_13c[0].y;
              std::
              __shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1a5564);
              syntactic::ParamSet::getParamTexture
                        (in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
              findOrCreateTexture(in_stack_fffffffffffffd48,
                                  (SP *)CONCAT17(in_stack_fffffffffffffd47,
                                                 CONCAT16(in_stack_fffffffffffffd46,
                                                          CONCAT24(in_stack_fffffffffffffd44,
                                                                   in_stack_fffffffffffffd40))));
              std::__shared_ptr_access<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1a55aa);
              std::shared_ptr<pbrt::Texture>::operator=
                        ((shared_ptr<pbrt::Texture> *)in_stack_fffffffffffffcf0,
                         (shared_ptr<pbrt::Texture> *)in_stack_fffffffffffffce8);
              std::shared_ptr<pbrt::Texture>::~shared_ptr((shared_ptr<pbrt::Texture> *)0x1a55cb);
              std::shared_ptr<pbrt::syntactic::Texture>::~shared_ptr
                        ((shared_ptr<pbrt::syntactic::Texture> *)0x1a55d8);
            }
            else {
              in_stack_fffffffffffffd48 =
                   (SemanticParser *)
                   std::
                   __shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x1a560d);
              std::__shared_ptr_access<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1a561f);
              syntactic::ParamSet::getParam3f
                        (in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
                         in_stack_fffffffffffffdc8);
            }
          }
          else {
            in_stack_fffffffffffffd47 =
                 std::operator==(&in_stack_fffffffffffffcf0->first,(char *)in_stack_fffffffffffffce8
                                );
            if ((bool)in_stack_fffffffffffffd47) {
              std::
              __shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1a5675);
              in_stack_fffffffffffffd46 =
                   syntactic::ParamSet::hasParamTexture
                             ((ParamSet *)
                              CONCAT17(in_stack_fffffffffffffd07,
                                       CONCAT16(in_stack_fffffffffffffd06,
                                                CONCAT24(in_stack_fffffffffffffd04,
                                                         in_stack_fffffffffffffd00))),
                              (string *)
                              CONCAT17(in_stack_fffffffffffffcff,
                                       CONCAT16(in_stack_fffffffffffffcfe,in_stack_fffffffffffffcf8)
                                      ));
              if ((bool)in_stack_fffffffffffffd46) {
                peVar4 = std::
                         __shared_ptr_access<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)0x1a56a5);
                peVar4->alpha = 1.0;
                std::
                __shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x1a56bc);
                syntactic::ParamSet::getParamTexture
                          (in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
                findOrCreateTexture(in_stack_fffffffffffffd48,
                                    (SP *)CONCAT17(in_stack_fffffffffffffd47,
                                                   CONCAT16(in_stack_fffffffffffffd46,
                                                            CONCAT24(in_stack_fffffffffffffd44,
                                                                     in_stack_fffffffffffffd40))));
                std::
                __shared_ptr_access<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1a5702);
                std::shared_ptr<pbrt::Texture>::operator=
                          ((shared_ptr<pbrt::Texture> *)in_stack_fffffffffffffcf0,
                           (shared_ptr<pbrt::Texture> *)in_stack_fffffffffffffce8);
                std::shared_ptr<pbrt::Texture>::~shared_ptr((shared_ptr<pbrt::Texture> *)0x1a5726);
                std::shared_ptr<pbrt::syntactic::Texture>::~shared_ptr
                          ((shared_ptr<pbrt::syntactic::Texture> *)0x1a5733);
              }
              else {
                std::
                __shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x1a5768);
                in_stack_fffffffffffffd40 =
                     syntactic::ParamSet::getParam1f
                               (in_RSI,(string *)name_00,(float)((ulong)in_RDI >> 0x20));
                peVar4 = std::
                         __shared_ptr_access<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)0x1a5790);
                peVar4->alpha = in_stack_fffffffffffffd40;
              }
            }
            else {
              uVar2 = std::operator==(&in_stack_fffffffffffffcf0->first,
                                      (char *)in_stack_fffffffffffffce8);
              if ((bool)uVar2) {
                std::
                __shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x1a57d7);
                in_stack_fffffffffffffd3e =
                     syntactic::ParamSet::hasParamTexture
                               ((ParamSet *)
                                CONCAT17(in_stack_fffffffffffffd07,
                                         CONCAT16(in_stack_fffffffffffffd06,
                                                  CONCAT24(in_stack_fffffffffffffd04,
                                                           in_stack_fffffffffffffd00))),
                                (string *)
                                CONCAT17(in_stack_fffffffffffffcff,
                                         CONCAT16(in_stack_fffffffffffffcfe,
                                                  in_stack_fffffffffffffcf8)));
                if ((bool)in_stack_fffffffffffffd3e) {
                  math::vec3f::vec3f(local_18c,1.0);
                  peVar4 = std::
                           __shared_ptr_access<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)0x1a581e);
                  (peVar4->opacity).z = local_18c[0].z;
                  (peVar4->opacity).x = local_18c[0].x;
                  (peVar4->opacity).y = local_18c[0].y;
                  std::
                  __shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1a5847);
                  syntactic::ParamSet::getParamTexture
                            (in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
                  findOrCreateTexture(in_stack_fffffffffffffd48,
                                      (SP *)CONCAT17(in_stack_fffffffffffffd47,
                                                     CONCAT16(in_stack_fffffffffffffd46,
                                                              CONCAT24(in_stack_fffffffffffffd44,
                                                                       in_stack_fffffffffffffd40))))
                  ;
                  std::
                  __shared_ptr_access<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1a588d);
                  std::shared_ptr<pbrt::Texture>::operator=
                            ((shared_ptr<pbrt::Texture> *)in_stack_fffffffffffffcf0,
                             (shared_ptr<pbrt::Texture> *)in_stack_fffffffffffffce8);
                  std::shared_ptr<pbrt::Texture>::~shared_ptr((shared_ptr<pbrt::Texture> *)0x1a58b1)
                  ;
                  std::shared_ptr<pbrt::syntactic::Texture>::~shared_ptr
                            ((shared_ptr<pbrt::syntactic::Texture> *)0x1a58be);
                }
                else {
                  in_stack_fffffffffffffd30 =
                       std::
                       __shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)0x1a58f3);
                  std::
                  __shared_ptr_access<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1a5905);
                  syntactic::ParamSet::getParam3f
                            (in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
                             in_stack_fffffffffffffdc8);
                }
              }
              else {
                bVar1 = std::operator==(&in_stack_fffffffffffffcf0->first,
                                        (char *)in_stack_fffffffffffffce8);
                in_stack_fffffffffffffd2c = CONCAT13(bVar1,(int3)in_stack_fffffffffffffd2c);
                if (bVar1) {
                  std::
                  __shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1a595b);
                  in_stack_fffffffffffffd28 =
                       syntactic::ParamSet::getParam1f
                                 (in_RSI,(string *)name_00,(float)((ulong)in_RDI >> 0x20));
                  peVar4 = std::
                           __shared_ptr_access<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)0x1a5983);
                  peVar4->index = in_stack_fffffffffffffd28;
                }
                else {
                  uVar3 = std::operator==(&in_stack_fffffffffffffcf0->first,
                                          (char *)in_stack_fffffffffffffce8);
                  if ((bool)uVar3) {
                    std::
                    __shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x1a59ca);
                    uVar2 = syntactic::ParamSet::hasParamTexture
                                      ((ParamSet *)
                                       CONCAT17(in_stack_fffffffffffffd07,
                                                CONCAT16(in_stack_fffffffffffffd06,
                                                         CONCAT24(in_stack_fffffffffffffd04,
                                                                  in_stack_fffffffffffffd00))),
                                       (string *)
                                       CONCAT17(in_stack_fffffffffffffcff,
                                                CONCAT16(in_stack_fffffffffffffcfe,
                                                         in_stack_fffffffffffffcf8)));
                    if ((bool)uVar2) {
                      std::
                      __shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x1a59fa);
                      syntactic::ParamSet::getParamTexture
                                (in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
                      findOrCreateTexture(in_stack_fffffffffffffd48,
                                          (SP *)CONCAT17(in_stack_fffffffffffffd47,
                                                         CONCAT16(in_stack_fffffffffffffd46,
                                                                  CONCAT24(in_stack_fffffffffffffd44
                                                                           ,
                                                  in_stack_fffffffffffffd40))));
                      std::
                      __shared_ptr_access<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x1a5a40);
                      std::shared_ptr<pbrt::Texture>::operator=
                                ((shared_ptr<pbrt::Texture> *)in_stack_fffffffffffffcf0,
                                 (shared_ptr<pbrt::Texture> *)in_stack_fffffffffffffce8);
                      std::shared_ptr<pbrt::Texture>::~shared_ptr
                                ((shared_ptr<pbrt::Texture> *)0x1a5a64);
                      std::shared_ptr<pbrt::syntactic::Texture>::~shared_ptr
                                ((shared_ptr<pbrt::syntactic::Texture> *)0x1a5a71);
                    }
                    else {
                      std::
                      __shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x1a5aa9);
                      in_stack_fffffffffffffd25 =
                           syntactic::ParamSet::hasParam1f
                                     ((ParamSet *)
                                      CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                                      (string *)
                                      CONCAT17(uVar3,CONCAT16(uVar2,CONCAT15(
                                                  in_stack_fffffffffffffd25,
                                                  CONCAT14(in_stack_fffffffffffffd24,
                                                           in_stack_fffffffffffffd20)))));
                      if (!(bool)in_stack_fffffffffffffd25) {
                        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
                        std::runtime_error::runtime_error
                                  (prVar5,"uber::roughness in un-recognized format...");
                        __cxa_throw(prVar5,&std::runtime_error::typeinfo,
                                    std::runtime_error::~runtime_error);
                      }
                      std::
                      __shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x1a5ad6);
                      in_stack_fffffffffffffd20 =
                           syntactic::ParamSet::getParam1f
                                     (in_RSI,(string *)name_00,(float)((ulong)in_RDI >> 0x20));
                      peVar4 = std::
                               __shared_ptr_access<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               ::operator->((__shared_ptr_access<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                             *)0x1a5afe);
                      peVar4->roughness = in_stack_fffffffffffffd20;
                    }
                  }
                  else {
                    bVar1 = std::operator==(&in_stack_fffffffffffffcf0->first,
                                            (char *)in_stack_fffffffffffffce8);
                    if (bVar1) {
                      std::
                      __shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x1a5ba9);
                      fVar6 = syntactic::ParamSet::getParam1f
                                        (in_RSI,(string *)name_00,(float)((ulong)in_RDI >> 0x20));
                      peVar4 = std::
                               __shared_ptr_access<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               ::operator->((__shared_ptr_access<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                             *)0x1a5bd1);
                      peVar4->uRoughness = fVar6;
                    }
                    else {
                      bVar1 = std::operator==(&in_stack_fffffffffffffcf0->first,
                                              (char *)in_stack_fffffffffffffce8);
                      if (bVar1) {
                        std::
                        __shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)0x1a5c15);
                        fVar6 = syntactic::ParamSet::getParam1f
                                          (in_RSI,(string *)name_00,(float)((ulong)in_RDI >> 0x20));
                        peVar4 = std::
                                 __shared_ptr_access<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 ::operator->((__shared_ptr_access<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                               *)0x1a5c3d);
                        peVar4->vRoughness = fVar6;
                      }
                      else {
                        in_stack_fffffffffffffd07 =
                             std::operator==(&in_stack_fffffffffffffcf0->first,
                                             (char *)in_stack_fffffffffffffce8);
                        if ((bool)in_stack_fffffffffffffd07) {
                          std::
                          __shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)0x1a5c84);
                          in_stack_fffffffffffffd06 =
                               syntactic::ParamSet::hasParamTexture
                                         ((ParamSet *)
                                          CONCAT17(in_stack_fffffffffffffd07,
                                                   CONCAT16(in_stack_fffffffffffffd06,
                                                            CONCAT24(in_stack_fffffffffffffd04,
                                                                     in_stack_fffffffffffffd00))),
                                          (string *)
                                          CONCAT17(in_stack_fffffffffffffcff,
                                                   CONCAT16(in_stack_fffffffffffffcfe,
                                                            in_stack_fffffffffffffcf8)));
                          if ((bool)in_stack_fffffffffffffd06) {
                            peVar4 = std::
                                     __shared_ptr_access<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     ::operator->((
                                                  __shared_ptr_access<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)0x1a5cb4);
                            peVar4->shadowAlpha = 1.0;
                            std::
                            __shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            ::operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                          *)0x1a5ccb);
                            syntactic::ParamSet::getParamTexture
                                      (in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
                            findOrCreateTexture(in_stack_fffffffffffffd48,
                                                (SP *)CONCAT17(in_stack_fffffffffffffd47,
                                                               CONCAT16(in_stack_fffffffffffffd46,
                                                                        CONCAT24(
                                                  in_stack_fffffffffffffd44,
                                                  in_stack_fffffffffffffd40))));
                            std::
                            __shared_ptr_access<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            ::operator->((__shared_ptr_access<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                          *)0x1a5d11);
                            std::shared_ptr<pbrt::Texture>::operator=
                                      ((shared_ptr<pbrt::Texture> *)in_stack_fffffffffffffcf0,
                                       (shared_ptr<pbrt::Texture> *)in_stack_fffffffffffffce8);
                            std::shared_ptr<pbrt::Texture>::~shared_ptr
                                      ((shared_ptr<pbrt::Texture> *)0x1a5d35);
                            std::shared_ptr<pbrt::syntactic::Texture>::~shared_ptr
                                      ((shared_ptr<pbrt::syntactic::Texture> *)0x1a5d42);
                          }
                          else {
                            std::
                            __shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            ::operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                          *)0x1a5d77);
                            in_stack_fffffffffffffd00 =
                                 syntactic::ParamSet::getParam1f
                                           (in_RSI,(string *)name_00,(float)((ulong)in_RDI >> 0x20))
                            ;
                            peVar4 = std::
                                     __shared_ptr_access<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     ::operator->((
                                                  __shared_ptr_access<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)0x1a5d9f);
                            peVar4->shadowAlpha = in_stack_fffffffffffffd00;
                          }
                        }
                        else {
                          in_stack_fffffffffffffcff =
                               std::operator==(&in_stack_fffffffffffffcf0->first,
                                               (char *)in_stack_fffffffffffffce8);
                          if ((bool)in_stack_fffffffffffffcff) {
                            std::
                            __shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            ::operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                          *)0x1a5de6);
                            syntactic::ParamSet::getParamTexture
                                      (in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
                            findOrCreateTexture(in_stack_fffffffffffffd48,
                                                (SP *)CONCAT17(in_stack_fffffffffffffd47,
                                                               CONCAT16(in_stack_fffffffffffffd46,
                                                                        CONCAT24(
                                                  in_stack_fffffffffffffd44,
                                                  in_stack_fffffffffffffd40))));
                            std::
                            __shared_ptr_access<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            ::operator->((__shared_ptr_access<pbrt::UberMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                          *)0x1a5e2c);
                            std::shared_ptr<pbrt::Texture>::operator=
                                      ((shared_ptr<pbrt::Texture> *)in_stack_fffffffffffffcf0,
                                       (shared_ptr<pbrt::Texture> *)in_stack_fffffffffffffce8);
                            std::shared_ptr<pbrt::Texture>::~shared_ptr
                                      ((shared_ptr<pbrt::Texture> *)0x1a5e50);
                            std::shared_ptr<pbrt::syntactic::Texture>::~shared_ptr
                                      ((shared_ptr<pbrt::syntactic::Texture> *)0x1a5e5d);
                          }
                          else {
                            in_stack_fffffffffffffcfe =
                                 std::operator==(&in_stack_fffffffffffffcf0->first,
                                                 (char *)in_stack_fffffffffffffce8);
                            if (!(bool)in_stack_fffffffffffffcfe) {
                              prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
                              std::operator+((char *)CONCAT17(uVar2,CONCAT16(
                                                  in_stack_fffffffffffffd3e,
                                                  in_stack_fffffffffffffd38)),
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)in_stack_fffffffffffffd30);
                              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)CONCAT17(in_stack_fffffffffffffcff,
                                                         CONCAT16(in_stack_fffffffffffffcfe,
                                                                  in_stack_fffffffffffffcf8)),
                                             (char *)prVar5);
                              std::runtime_error::runtime_error
                                        (prVar5,(string *)&stack0xfffffffffffffdd0);
                              __cxa_throw(prVar5,&std::runtime_error::typeinfo,
                                          std::runtime_error::~runtime_error);
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::~string(local_a0);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
    ::~pair(in_stack_fffffffffffffcf0);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>
                  *)in_stack_fffffffffffffcf0);
  } while( true );
}

Assistant:

Material::SP SemanticParser::createMaterial_uber(pbrt::syntactic::Material::SP in)
  {
    UberMaterial::SP mat = std::make_shared<UberMaterial>(in->name);
    for (auto it : in->param) {
      std::string name = it.first;
      if (name == "Kd") {
        if (in->hasParamTexture(name)) {
          mat->kd = vec3f(1.f);
          mat->map_kd = findOrCreateTexture(in->getParamTexture(name));
        } else
          in->getParam3f(&mat->kd.x,name);
      }
      else if (name == "Kr") {
        if (in->hasParamTexture(name)) {
          mat->kr = vec3f(1.f);
          mat->map_kr = findOrCreateTexture(in->getParamTexture(name));
        } else
          in->getParam3f(&mat->kr.x,name);
      }
      else if (name == "Kt") {
        if (in->hasParamTexture(name)) {
          mat->kt = vec3f(1.f);
          mat->map_kt = findOrCreateTexture(in->getParamTexture(name));
        } else
          in->getParam3f(&mat->kt.x,name);
      }
      else if (name == "Ks") {
        if (in->hasParamTexture(name)) {
          mat->ks = vec3f(1.f);
          mat->map_ks = findOrCreateTexture(in->getParamTexture(name));
        } else
          in->getParam3f(&mat->ks.x,name);
      }
      else if (name == "alpha") {
        if (in->hasParamTexture(name)) {
          mat->alpha = 1.f;
          mat->map_alpha = findOrCreateTexture(in->getParamTexture(name));
        } else
          mat->alpha = in->getParam1f(name);
      }
      else if (name == "opacity") {
        if (in->hasParamTexture(name)) {
          mat->opacity = vec3f(1.f);
          mat->map_opacity = findOrCreateTexture(in->getParamTexture(name));
        } else
          in->getParam3f(&mat->opacity.x,name);
      }
      else if (name == "index") {
        mat->index = in->getParam1f(name);
      }
      else if (name == "roughness") {
        if (in->hasParamTexture(name))
          mat->map_roughness = findOrCreateTexture(in->getParamTexture(name));
        else if (in->hasParam1f(name))
          mat->roughness = in->getParam1f(name);
        else
          throw std::runtime_error("uber::roughness in un-recognized format...");
        // else
        //   in->getParam3f(&mat->roughness.x,name);
      }
      else if (name == "uroughness") {
        // if (in->hasParamTexture(name))
        //   mat->map_uRoughness = findOrCreateTexture(in->getParamTexture(name));
        // else
          mat->uRoughness = in->getParam1f(name);
      }
      else if (name == "vroughness") {
        // if (in->hasParamTexture(name))
        //   mat->map_vRoughness = findOrCreateTexture(in->getParamTexture(name));
        // else
          mat->vRoughness = in->getParam1f(name);
      }
      // else if (name == "remaproughness") {
      //   mat->remapRoughness = in->getParamBool(name);
      // }
      else if (name == "shadowalpha") {
        if (in->hasParamTexture(name)) {
          mat->shadowAlpha = 1.f;
          mat->map_shadowAlpha = findOrCreateTexture(in->getParamTexture(name));
        } else
          mat->shadowAlpha = in->getParam1f(name);
      }
      else if (name == "bumpmap") {
        mat->map_bump = findOrCreateTexture(in->getParamTexture(name));
      }
      else if (name == "type") {
        /* ignore */
      } else
        throw std::runtime_error("un-handled uber-material parameter '"+it.first+"'");
    };
    return mat;
  }